

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_path_rect_to(nk_draw_list *list,nk_vec2 a,nk_vec2 b,float rounding)

{
  nk_vec2 center;
  nk_vec2 center_00;
  nk_vec2 center_01;
  nk_vec2 center_02;
  nk_vec2 pos;
  nk_vec2 pos_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar3 = b.x;
  fVar4 = b.y;
  fVar1 = a.x;
  fVar2 = a.y;
  if (list == (nk_draw_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2709,
                  "void nk_draw_list_path_rect_to(struct nk_draw_list *, struct nk_vec2, struct nk_vec2, float)"
                 );
  }
  fVar5 = fVar3 - fVar1;
  fVar6 = -fVar5;
  if (-fVar5 <= fVar5) {
    fVar6 = fVar5;
  }
  if (fVar6 <= rounding) {
    rounding = fVar6;
  }
  fVar5 = fVar4 - fVar2;
  fVar6 = -fVar5;
  if (-fVar5 <= fVar5) {
    fVar6 = fVar5;
  }
  if (fVar6 <= rounding) {
    rounding = fVar6;
  }
  if ((rounding == 0.0) && (!NAN(rounding))) {
    nk_draw_list_path_line_to(list,a);
    pos.y = fVar2;
    pos.x = fVar3;
    nk_draw_list_path_line_to(list,pos);
    nk_draw_list_path_line_to(list,b);
    pos_00.y = fVar4;
    pos_00.x = fVar1;
    nk_draw_list_path_line_to(list,pos_00);
    return;
  }
  center.y = fVar2 + rounding;
  center.x = fVar1 + rounding;
  nk_draw_list_path_arc_to_fast(list,center,rounding,6,9);
  center_00.y = fVar2 + rounding;
  center_00.x = fVar3 - rounding;
  nk_draw_list_path_arc_to_fast(list,center_00,rounding,9,0xc);
  center_01.y = fVar4 - rounding;
  center_01.x = fVar3 - rounding;
  nk_draw_list_path_arc_to_fast(list,center_01,rounding,0,3);
  center_02.y = fVar4 - rounding;
  center_02.x = fVar1 + rounding;
  nk_draw_list_path_arc_to_fast(list,center_02,rounding,3,6);
  return;
}

Assistant:

NK_API void
nk_draw_list_path_rect_to(struct nk_draw_list *list, struct nk_vec2 a,
    struct nk_vec2 b, float rounding)
{
    float r;
    NK_ASSERT(list);
    if (!list) return;
    r = rounding;
    r = NK_MIN(r, ((b.x-a.x) < 0) ? -(b.x-a.x): (b.x-a.x));
    r = NK_MIN(r, ((b.y-a.y) < 0) ? -(b.y-a.y): (b.y-a.y));

    if (r == 0.0f) {
        nk_draw_list_path_line_to(list, a);
        nk_draw_list_path_line_to(list, nk_vec2(b.x,a.y));
        nk_draw_list_path_line_to(list, b);
        nk_draw_list_path_line_to(list, nk_vec2(a.x,b.y));
    } else {
        nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, a.y + r), r, 6, 9);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, a.y + r), r, 9, 12);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(b.x - r, b.y - r), r, 0, 3);
        nk_draw_list_path_arc_to_fast(list, nk_vec2(a.x + r, b.y - r), r, 3, 6);
    }
}